

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * TagToken(TidyDocImpl *doc,NodeType type)

{
  Lexer *lexer_00;
  Node *node_00;
  tmbstr ptVar1;
  Node *node;
  Lexer *lexer;
  NodeType type_local;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  node_00 = prvTidyNewNode(lexer_00->allocator,lexer_00);
  node_00->type = type;
  ptVar1 = prvTidytmbstrndup(doc->allocator,lexer_00->lexbuf + lexer_00->txtstart,
                             lexer_00->txtend - lexer_00->txtstart);
  node_00->element = ptVar1;
  node_00->start = lexer_00->txtstart;
  node_00->end = lexer_00->txtstart;
  if (((type == StartTag) || (type == StartEndTag)) || (type == EndTag)) {
    prvTidyFindTag(doc,node_00);
  }
  return node_00;
}

Assistant:

static Node* TagToken( TidyDocImpl* doc, NodeType type )
{
    Lexer* lexer = doc->lexer;
    Node* node = TY_(NewNode)( lexer->allocator, lexer );
    node->type = type;
    node->element = TY_(tmbstrndup)( doc->allocator,
                                     lexer->lexbuf + lexer->txtstart,
                                     lexer->txtend - lexer->txtstart );
    node->start = lexer->txtstart;
    node->end = lexer->txtstart;

    if ( type == StartTag || type == StartEndTag || type == EndTag )
        TY_(FindTag)(doc, node);

    return node;
}